

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-magic.c
# Opt level: O1

_Bool borg_spell(borg_spells spell)

{
  short sVar1;
  _Bool _Var2;
  long lVar3;
  char *what;
  long lVar4;
  borg_spells *pbVar5;
  uint uVar6;
  borg_magic *pbVar7;
  
  pbVar7 = borg_magics;
  uVar6 = 0xffffffff;
  if ((borg_magics != (borg_magic *)0x0) &&
     (lVar3 = (long)(player->class->magic).total_spells, 0 < lVar3)) {
    pbVar5 = &borg_magics->spell_enum;
    lVar4 = 0;
    do {
      if (*pbVar5 == spell) {
        uVar6 = (uint)lVar4;
        break;
      }
      lVar4 = lVar4 + 1;
      pbVar5 = pbVar5 + 8;
    } while (lVar3 != lVar4);
  }
  if ((-1 < (int)uVar6) && (_Var2 = borg_spell_okay(spell), _Var2)) {
    pbVar7 = pbVar7 + uVar6;
    sVar1 = borg.book_idx[pbVar7->book];
    if (-1 < sVar1) {
      what = format("# Casting %s (%d,%d).",pbVar7->name,(ulong)(uint)(int)sVar1,
                    (ulong)(uint)pbVar7->book_offset);
      borg_note(what);
      borg_keypress(0x6d);
      borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[(int)sVar1]);
      borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[pbVar7->book_offset]);
      pbVar7->times = pbVar7->times + 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool borg_spell(const enum borg_spells spell)
{
    int i;

    int spell_num = borg_get_spell_number(spell);
    if (spell_num < 0)
        return false;

    borg_magic *as = &borg_magics[spell_num];

    /* Require ability (right now) */
    if (!borg_spell_okay(spell))
        return false;

    /* Look for the book */
    i = borg.book_idx[as->book];

    /* Paranoia */
    if (i < 0)
        return false;

    /* Debugging Info */
    borg_note(format("# Casting %s (%d,%d).", as->name, i, as->book_offset));

    /* Cast a spell */
    borg_keypress('m');
    borg_keypress(all_letters_nohjkl[i]);
    borg_keypress(all_letters_nohjkl[as->book_offset]);

    /* increment the spell counter */
    as->times++;

    /* Success */
    return true;
}